

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::AssertionResult::AssertionResult(AssertionResult *this,AssertionResult *param_2)

{
  AssertionInfo *in_RDI;
  AssertionInfo *unaff_retaddr;
  
  AssertionInfo::AssertionInfo(unaff_retaddr,in_RDI);
  AssertionResultData::AssertionResultData
            ((AssertionResultData *)unaff_retaddr,(AssertionResultData *)in_RDI);
  return;
}

Assistant:

AssertionResult( AssertionResult const& )              = default;